

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_convolve_avx2.c
# Opt level: O2

void aom_highbd_filter_block1d8_v4_avx2
               (uint16_t *src_ptr,ptrdiff_t src_pitch,uint16_t *dst_ptr,ptrdiff_t dst_pitch,
               uint32_t height,int16_t *filter,int bd)

{
  undefined4 uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined2 uVar6;
  long lVar7;
  uint uVar8;
  undefined2 uVar9;
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  
  uVar9 = 0xff;
  if (bd == 0xc) {
    uVar9 = 0xfff;
  }
  uVar6 = 0x3ff;
  if (bd != 10) {
    uVar6 = uVar9;
  }
  auVar10._2_2_ = uVar6;
  auVar10._0_2_ = uVar6;
  auVar10._4_2_ = uVar6;
  auVar10._6_2_ = uVar6;
  auVar10._8_2_ = uVar6;
  auVar10._10_2_ = uVar6;
  auVar10._12_2_ = uVar6;
  auVar10._14_2_ = uVar6;
  auVar10._16_2_ = uVar6;
  auVar10._18_2_ = uVar6;
  auVar10._20_2_ = uVar6;
  auVar10._22_2_ = uVar6;
  auVar10._24_2_ = uVar6;
  auVar10._26_2_ = uVar6;
  auVar10._28_2_ = uVar6;
  auVar10._30_2_ = uVar6;
  uVar1 = *(undefined4 *)(filter + 2);
  auVar11._4_4_ = uVar1;
  auVar11._0_4_ = uVar1;
  auVar11._8_4_ = uVar1;
  auVar11._12_4_ = uVar1;
  auVar11._16_4_ = uVar1;
  auVar11._20_4_ = uVar1;
  auVar11._24_4_ = uVar1;
  auVar11._28_4_ = uVar1;
  uVar1 = *(undefined4 *)(filter + 4);
  auVar12._4_4_ = uVar1;
  auVar12._0_4_ = uVar1;
  auVar12._8_4_ = uVar1;
  auVar12._12_4_ = uVar1;
  auVar12._16_4_ = uVar1;
  auVar12._20_4_ = uVar1;
  auVar12._24_4_ = uVar1;
  auVar12._28_4_ = uVar1;
  auVar2 = *(undefined1 (*) [16])(src_ptr + src_pitch * 3);
  auVar13._0_16_ =
       ZEXT116(0) * auVar2 + ZEXT116(1) * *(undefined1 (*) [16])(src_ptr + src_pitch * 2);
  auVar13._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar2;
  auVar3 = *(undefined1 (*) [16])(src_ptr + src_pitch * 4);
  auVar15._0_16_ = ZEXT116(0) * auVar3 + ZEXT116(1) * auVar2;
  auVar15._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar3;
  auVar5 = vpunpcklwd_avx2(auVar13,auVar15);
  auVar13 = vpunpckhwd_avx2(auVar13,auVar15);
  auVar14._8_4_ = 0x40;
  auVar14._0_8_ = 0x4000000040;
  auVar14._12_4_ = 0x40;
  auVar14._16_4_ = 0x40;
  auVar14._20_4_ = 0x40;
  auVar14._24_4_ = 0x40;
  auVar14._28_4_ = 0x40;
  for (uVar8 = 0; uVar8 < height; uVar8 = uVar8 + 2) {
    lVar7 = (ulong)uVar8 * src_pitch;
    auVar2 = *(undefined1 (*) [16])(src_ptr + lVar7 + src_pitch * 5);
    auVar16._0_16_ = ZEXT116(0) * auVar2 + ZEXT116(1) * auVar3;
    auVar16._16_16_ = ZEXT116(1) * auVar2;
    auVar3 = *(undefined1 (*) [16])(src_ptr + lVar7 + src_pitch * 6);
    auVar17._0_16_ = ZEXT116(0) * auVar3 + ZEXT116(1) * auVar2;
    auVar17._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar3;
    auVar15 = vpmaddwd_avx2(auVar5,auVar11);
    auVar5 = vpunpcklwd_avx2(auVar16,auVar17);
    auVar4 = vpmaddwd_avx2(auVar13,auVar11);
    auVar13 = vpunpckhwd_avx2(auVar16,auVar17);
    auVar17 = vpmaddwd_avx2(auVar5,auVar12);
    auVar15 = vpaddd_avx2(auVar15,auVar14);
    auVar15 = vpaddd_avx2(auVar17,auVar15);
    auVar16 = vpsrad_avx2(auVar15,7);
    auVar17 = vpmaddwd_avx2(auVar13,auVar12);
    auVar15 = vpaddd_avx2(auVar4,auVar14);
    auVar15 = vpaddd_avx2(auVar17,auVar15);
    auVar15 = vpsrad_avx2(auVar15,7);
    auVar15 = vpackssdw_avx2(auVar16,auVar15);
    auVar15 = vpminsw_avx2(auVar15,auVar10);
    auVar15 = vpmaxsw_avx2(auVar15,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
    *(undefined1 (*) [16])(dst_ptr + (ulong)uVar8 * dst_pitch) = auVar15._0_16_;
    *(undefined1 (*) [16])
     ((long)*(undefined1 (*) [16])(dst_ptr + (ulong)uVar8 * dst_pitch) + dst_pitch * 2) =
         auVar15._16_16_;
  }
  return;
}

Assistant:

static void aom_highbd_filter_block1d8_v4_avx2(
    const uint16_t *src_ptr, ptrdiff_t src_pitch, uint16_t *dst_ptr,
    ptrdiff_t dst_pitch, uint32_t height, const int16_t *filter, int bd) {
  const int bits = FILTER_BITS;

  const __m128i round_shift_bits = _mm_cvtsi32_si128(bits);
  const __m256i round_const_bits = _mm256_set1_epi32((1 << bits) >> 1);
  const __m256i clip_pixel =
      _mm256_set1_epi16(bd == 10 ? 1023 : (bd == 12 ? 4095 : 255));
  const __m256i zero = _mm256_setzero_si256();
  __m256i s[4], ff[2];
  uint32_t i;
  pack_filters_4tap(filter, ff);

  const uint16_t *data = src_ptr;
  /* Vertical filter */
  {
    __m128i s2 = _mm_loadu_si128((__m128i *)(data + 2 * src_pitch));
    __m128i s3 = _mm_loadu_si128((__m128i *)(data + 3 * src_pitch));

    __m256i s23 = _mm256_inserti128_si256(_mm256_castsi128_si256(s2), s3, 1);

    __m128i s4 = _mm_loadu_si128((__m128i *)(data + 4 * src_pitch));

    __m256i s34 = _mm256_inserti128_si256(_mm256_castsi128_si256(s3), s4, 1);

    s[0] = _mm256_unpacklo_epi16(s23, s34);
    s[2] = _mm256_unpackhi_epi16(s23, s34);

    for (i = 0; i < height; i += 2) {
      data = &src_ptr[i * src_pitch];

      __m128i s5 = _mm_loadu_si128((__m128i *)(data + 5 * src_pitch));
      __m128i s6 = _mm_loadu_si128((__m128i *)(data + 6 * src_pitch));

      __m256i s45 = _mm256_inserti128_si256(_mm256_castsi128_si256(s4), s5, 1);
      __m256i s56 = _mm256_inserti128_si256(_mm256_castsi128_si256(s5), s6, 1);

      s[1] = _mm256_unpacklo_epi16(s45, s56);
      s[3] = _mm256_unpackhi_epi16(s45, s56);

      const __m256i res_a = convolve_4tap(s, ff);

      __m256i res_a_round = _mm256_sra_epi32(
          _mm256_add_epi32(res_a, round_const_bits), round_shift_bits);

      const __m256i res_b = convolve_4tap(s + 2, ff);
      __m256i res_b_round = _mm256_sra_epi32(
          _mm256_add_epi32(res_b, round_const_bits), round_shift_bits);

      __m256i res_16bit = _mm256_packs_epi32(res_a_round, res_b_round);
      res_16bit = _mm256_min_epi16(res_16bit, clip_pixel);
      res_16bit = _mm256_max_epi16(res_16bit, zero);

      _mm_storeu_si128((__m128i *)&dst_ptr[i * dst_pitch],
                       _mm256_castsi256_si128(res_16bit));
      _mm_storeu_si128((__m128i *)&dst_ptr[i * dst_pitch + dst_pitch],
                       _mm256_extracti128_si256(res_16bit, 1));

      s[0] = s[1];
      s[2] = s[3];
      s4 = s6;
    }
  }
}